

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall SQVM::TypeOf(SQVM *this,SQObjectPtr *obj1,SQObjectPtr *dest)

{
  SQTable *pSVar1;
  SQSharedState *ss;
  uint uVar2;
  SQChar *s;
  SQString *x;
  bool bVar3;
  undefined1 local_38 [8];
  SQObjectPtr closure;
  SQObjectPtr *dest_local;
  SQObjectPtr *obj1_local;
  SQVM *this_local;
  
  closure.super_SQObject._unVal = (SQObjectValue)dest;
  if ((((obj1->super_SQObject)._type & 0x2000000) != 0) &&
     ((((obj1->super_SQObject)._unVal.pTable)->super_SQDelegable)._delegate != (SQTable *)0x0)) {
    ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_38);
    pSVar1 = (obj1->super_SQObject)._unVal.pTable;
    uVar2 = (*(pSVar1->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
              [6])(pSVar1,this,8,(SQObjectPtr *)local_38);
    bVar3 = (uVar2 & 1) != 0;
    if (bVar3) {
      Push(this,obj1);
      this_local._7_1_ =
           CallMetaMethod(this,(SQObjectPtr *)local_38,MT_TYPEOF,1,
                          (SQObjectPtr *)closure.super_SQObject._unVal.pTable);
    }
    ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_38);
    if (bVar3) goto LAB_001c6c4b;
  }
  ss = this->_sharedstate;
  s = GetTypeName(obj1);
  x = SQString::Create(ss,s,-1);
  ::SQObjectPtr::operator=((SQObjectPtr *)closure.super_SQObject._unVal.pTable,x);
  this_local._7_1_ = 1;
LAB_001c6c4b:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool SQVM::TypeOf(const SQObjectPtr &obj1,SQObjectPtr &dest)
{
    if(is_delegable(obj1) && _delegable(obj1)->_delegate) {
        SQObjectPtr closure;
        if(_delegable(obj1)->GetMetaMethod(this, MT_TYPEOF, closure)) {
            Push(obj1);
            return CallMetaMethod(closure,MT_TYPEOF,1,dest);
        }
    }
    dest = SQString::Create(_ss(this),GetTypeName(obj1));
    return true;
}